

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dynamic_stream.h
# Opt level: O2

ssize_t __thiscall
crnlib::dynamic_stream::write(dynamic_stream *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  ulong uVar2;
  uint new_size;
  undefined4 in_register_00000034;
  
  uVar2 = 0;
  if (((this->super_data_stream).field_0x1a & 1) != 0) {
    if (((int)__buf != 0) && (((this->super_data_stream).m_attribs & 2) != 0)) {
      uVar1 = this->m_ofs;
      new_size = uVar1 + (int)__buf;
      if ((this->m_buf).m_size < new_size) {
        vector<unsigned_char>::resize(&this->m_buf,new_size,false);
        uVar1 = this->m_ofs;
      }
      memcpy((this->m_buf).m_p + uVar1,(void *)CONCAT44(in_register_00000034,__fd),
             (ulong)__buf & 0xffffffff);
      this->m_ofs = new_size;
      uVar2 = (ulong)__buf & 0xffffffff;
    }
  }
  return uVar2;
}

Assistant:

virtual uint write(const void* pBuf, uint len)
        {
            CRNLIB_ASSERT(pBuf && (len <= 0x7FFFFFFF));

            if ((!m_opened) || (!is_writable()) || (!len))
            {
                return 0;
            }

            CRNLIB_ASSERT(m_ofs <= m_buf.size());

            uint new_ofs = m_ofs + len;
            if (new_ofs > m_buf.size())
            {
                m_buf.resize(new_ofs);
            }

            memcpy(&m_buf[m_ofs], pBuf, len);
            m_ofs = new_ofs;

            return len;
        }